

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<asl::String> * __thiscall asl::Array<asl::String>::resize(Array<asl::String> *this,int m)

{
  int iVar1;
  String *pSVar2;
  long lVar3;
  
  iVar1 = *(int *)&this->_a[-1].field_2;
  reserve(this,m);
  if (iVar1 < m) {
    pSVar2 = this->_a;
    lVar3 = (long)iVar1 * 0x18;
    do {
      (pSVar2->field_2)._space[lVar3] = '\0';
      *(undefined8 *)((long)&pSVar2->_size + lVar3) = 0;
      lVar3 = lVar3 + 0x18;
    } while ((long)m * 0x18 != lVar3);
  }
  else if (m < iVar1) {
    pSVar2 = this->_a;
    lVar3 = (long)m * 0x18;
    do {
      if (*(int *)((long)&pSVar2->_size + lVar3) != 0) {
        ::free(*(void **)((long)&pSVar2->field_2 + lVar3));
      }
      lVar3 = lVar3 + 0x18;
    } while ((long)iVar1 * 0x18 != lVar3);
  }
  *(int *)&this->_a[-1].field_2 = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}